

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml2.cpp
# Opt level: O3

void __thiscall tinyxml2::XMLPrinter::PushText(XMLPrinter *this,char *text,bool cdata)

{
  size_t size;
  
  this->_textDepth = this->_depth + -1;
  if (this->_elementJustOpened == true) {
    this->_elementJustOpened = false;
    Putc(this,'>');
  }
  if (cdata) {
    Write(this,"<![CDATA[",9);
    size = strlen(text);
    Write(this,text,size);
    Write(this,"]]>",3);
    return;
  }
  PrintString(this,text,true);
  return;
}

Assistant:

void XMLPrinter::PushText(const char* text, bool cdata)
{
    _textDepth = _depth - 1;

    SealElementIfJustOpened();
    if (cdata) {
        Write("<![CDATA[");
        Write(text);
        Write("]]>");
    } else {
        PrintString(text, true);
    }
}